

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.h
# Opt level: O1

half Imf_3_4::round12log(half x)

{
  double dVar1;
  char cVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  float fVar7;
  
  fVar7 = *(float *)(_imath_half_to_float_table + (ulong)x._h * 4);
  if (fVar7 <= 0.0) {
    return (half)0;
  }
  fVar7 = logf(fVar7 / 0.17677669);
  iVar4 = (int)((fVar7 * 200.0) / 0.6931472 + 2000.5);
  iVar5 = 0xfff;
  if (iVar4 < 0xfff) {
    iVar5 = iVar4;
  }
  iVar4 = 1;
  if (1 < iVar5) {
    iVar4 = iVar5;
  }
  dVar1 = exp2((double)(iVar4 + -2000) / 200.0);
  fVar7 = ABS((float)(dVar1 * 0.1767766922712326));
  uVar3 = (ushort)((uint)(float)(dVar1 * 0.1767766922712326) >> 0x10) & 0x8000;
  if ((uint)fVar7 < 0x38800000) {
    if ((0x33000000 < (uint)fVar7) &&
       (uVar6 = (uint)fVar7 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar7 >> 0x17),
       uVar3 = uVar3 | (ushort)(uVar6 >> (0x7eU - cVar2 & 0x1f)),
       0x80000000 < uVar6 << (cVar2 + 0xa2U & 0x1f))) {
      return (half)(uVar3 + 1);
    }
  }
  else if ((uint)fVar7 < 0x7f800000) {
    if (0x477fefff < (uint)fVar7) {
      return (half)(uVar3 | 0x7c00);
    }
    uVar3 = (ushort)((int)fVar7 + 0x8000fff + (uint)(((uint)fVar7 >> 0xd & 1) != 0) >> 0xd) | uVar3;
  }
  else {
    uVar3 = uVar3 | 0x7c00;
    if (fVar7 != INFINITY) {
      uVar6 = (uint)fVar7 >> 0xd & 0x3ff;
      return (half)(uVar3 | (ushort)uVar6 | (ushort)(uVar6 == 0));
    }
  }
  return (half)uVar3;
}

Assistant:

static inline float
imath_half_to_float (imath_half_bits_t h)
{
#if defined(__F16C__)
    // NB: The intel implementation does seem to treat NaN slightly
    // different than the original toFloat table does (i.e. where the
    // 1 bits are, meaning the signalling or not bits). This seems
    // benign, given that the original library didn't really deal with
    // signalling vs non-signalling NaNs
#    ifdef _MSC_VER
    /* msvc does not seem to have cvtsh_ss :( */
    return _mm_cvtss_f32 (_mm_cvtph_ps (_mm_set1_epi16 (h)));
#    else
    return _cvtsh_ss (h);
#    endif
#elif defined(IMATH_HALF_USE_LOOKUP_TABLE) &&                                  \
    !defined(IMATH_HALF_NO_LOOKUP_TABLE)
    return imath_half_to_float_table[h].f;
#else
    imath_half_uif_t v;
    // this code would be clearer, although it does appear to be faster
    // (1.06 vs 1.08 ns/call) to avoid the constants and just do 4
    // shifts.
    //
    uint32_t hexpmant = ((uint32_t) (h) << 17) >> 4;
    v.i               = ((uint32_t) (h >> 15)) << 31;

    // the likely really does help if most of your numbers are "normal" half numbers
    if (IMATH_LIKELY ((hexpmant >= 0x00800000)))
    {
        v.i |= hexpmant;
        // either we are a normal number, in which case add in the bias difference
        // otherwise make sure all exponent bits are set
        if (IMATH_LIKELY ((hexpmant < 0x0f800000)))
            v.i += 0x38000000;
        else
            v.i |= 0x7f800000;
    }
    else if (hexpmant != 0)
    {
        // exponent is 0 because we're denormal, don't have to extract
        // the mantissa, can just use as is
        //
        //
        // other compilers may provide count-leading-zeros primitives,
        // but we need the community to inform us of the variants
        uint32_t lc;
#    if defined(_MSC_VER)
        // The direct intrinsic for this is __lznct, but that is not supported
        // on older x86_64 hardware or ARM. Instead uses the bsr instruction
        // and one additional subtraction. This assumes hexpmant != 0, for 0
        // bsr and lznct would behave differently.
        unsigned long bsr;
        _BitScanReverse (&bsr, hexpmant);
        lc = (31 - bsr);
#    elif defined(__GNUC__) || defined(__clang__)
        lc = (uint32_t) __builtin_clz (hexpmant);
#    else
        lc = 0;
        while (0 == ((hexpmant << lc) & 0x80000000))
            ++lc;
#    endif
        lc -= 8;
        // so nominally we want to remove that extra bit we shifted
        // up, but we are going to add that bit back in, then subtract
        // from it with the 0x38800000 - (lc << 23)....
        //
        // by combining, this allows us to skip the & operation (and
        // remove a constant)
        //
        // hexpmant &= ~0x00800000;
        v.i |= 0x38800000;
        // lc is now x, where the desired exponent is then
        // -14 - lc
        // + 127 -> new exponent
        v.i |= (hexpmant << lc);
        v.i -= (lc << 23);
    }
    return v.f;
#endif
}